

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O2

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,InterfacePortSymbol *symbol)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  DefinitionSymbol *pDVar3;
  ulong uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  value_type *elements;
  ulong pos0;
  uint uVar8;
  ulong hash;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  IfaceConn IVar17;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_(std::ranges::subrange_kind)0>
  sVar18;
  specific_symbol_iterator<slang::ast::MethodPrototypeSymbol> __begin5;
  specific_symbol_iterator<slang::ast::MethodPrototypeSymbol> local_68;
  _Storage<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true> local_60;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  bVar7 = handleDefault<slang::ast::InterfacePortSymbol>(this,symbol);
  if (bVar7) {
    InterfacePortSymbol::getDeclaredRange
              ((optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> *)
               &local_60._M_value,symbol);
    pDVar3 = symbol->interfaceDef;
    if (pDVar3 != (DefinitionSymbol *)0x0) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = pDVar3;
      hash = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
      pos0 = hash >> ((byte)(this->usedIfacePorts).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                            .arrays.groups_size_index & 0x3f);
      uVar2 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[hash & 0xff];
      uVar4 = (this->usedIfacePorts).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
              .arrays.groups_size_mask;
      uVar11 = 0;
      uVar10 = pos0;
      do {
        pgVar1 = (this->usedIfacePorts).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                 .arrays.groups_ + uVar10;
        local_48 = pgVar1->m[0].n;
        uStack_47 = pgVar1->m[1].n;
        uStack_46 = pgVar1->m[2].n;
        bStack_45 = pgVar1->m[3].n;
        uStack_44 = pgVar1->m[4].n;
        uStack_43 = pgVar1->m[5].n;
        uStack_42 = pgVar1->m[6].n;
        bStack_41 = pgVar1->m[7].n;
        uStack_40 = pgVar1->m[8].n;
        uStack_3f = pgVar1->m[9].n;
        uStack_3e = pgVar1->m[10].n;
        bStack_3d = pgVar1->m[0xb].n;
        uStack_3c = pgVar1->m[0xc].n;
        uStack_3b = pgVar1->m[0xd].n;
        uStack_3a = pgVar1->m[0xe].n;
        bStack_39 = pgVar1->m[0xf].n;
        uVar12 = (uchar)uVar2;
        auVar16[0] = -(local_48 == uVar12);
        uVar13 = (uchar)((uint)uVar2 >> 8);
        auVar16[1] = -(uStack_47 == uVar13);
        uVar14 = (uchar)((uint)uVar2 >> 0x10);
        auVar16[2] = -(uStack_46 == uVar14);
        bVar15 = (byte)((uint)uVar2 >> 0x18);
        auVar16[3] = -(bStack_45 == bVar15);
        auVar16[4] = -(uStack_44 == uVar12);
        auVar16[5] = -(uStack_43 == uVar13);
        auVar16[6] = -(uStack_42 == uVar14);
        auVar16[7] = -(bStack_41 == bVar15);
        auVar16[8] = -(uStack_40 == uVar12);
        auVar16[9] = -(uStack_3f == uVar13);
        auVar16[10] = -(uStack_3e == uVar14);
        auVar16[0xb] = -(bStack_3d == bVar15);
        auVar16[0xc] = -(uStack_3c == uVar12);
        auVar16[0xd] = -(uStack_3b == uVar13);
        auVar16[0xe] = -(uStack_3a == uVar14);
        auVar16[0xf] = -(bStack_39 == bVar15);
        for (uVar8 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe); uVar8 != 0;
            uVar8 = uVar8 - 1 & uVar8) {
          uVar5 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          if (pDVar3 == (this->usedIfacePorts).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                        .arrays.elements_[uVar10 * 0xf + (ulong)uVar5]) goto LAB_0032da09;
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_39) == 0) break;
        lVar9 = uVar10 + uVar11;
        uVar11 = uVar11 + 1;
        uVar10 = lVar9 + 1U & uVar4;
      } while (uVar11 <= uVar4);
      if ((this->usedIfacePorts).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
          .size_ctrl.size <
          (this->usedIfacePorts).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
        ::unchecked_emplace_at<slang::ast::DefinitionSymbol_const*const&>
                  ((locator *)&local_60._M_value,
                   (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
                    *)&this->usedIfacePorts,pos0,hash,&symbol->interfaceDef);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
        ::unchecked_emplace_with_rehash<slang::ast::DefinitionSymbol_const*const&>
                  ((locator *)&local_60._M_value,
                   (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
                    *)&this->usedIfacePorts,hash,&symbol->interfaceDef);
      }
LAB_0032da09:
      if ((symbol->modport)._M_len != 0) {
        IVar17 = InterfacePortSymbol::getConnection(symbol);
        local_60._M_value._M_extent._M_extent_value =
             (__extent_storage<18446744073709551615UL>)IVar17.second;
        if (local_60._M_value._M_extent._M_extent_value != 0) {
          sVar18 = Scope::membersOfType<slang::ast::MethodPrototypeSymbol>
                             ((Scope *)((long)local_60._M_value._M_extent._M_extent_value + 0x40));
          local_68 = sVar18._M_begin.current;
          while (local_68.current != sVar18._M_end.current.current) {
            if ((local_68.current[3].kind & Subroutine) != Unknown) {
              local_60._M_value._M_ptr = (pointer)symbol;
              SmallVectorBase<std::pair<slang::ast::InterfacePortSymbol_const*,slang::ast::ModportSymbol_const*>>
              ::
              emplace_back<std::pair<slang::ast::InterfacePortSymbol_const*,slang::ast::ModportSymbol_const*>>
                        ((SmallVectorBase<std::pair<slang::ast::InterfacePortSymbol_const*,slang::ast::ModportSymbol_const*>>
                          *)&this->modportsWithExports,
                         (pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>
                          *)&local_60._M_value);
              return;
            }
            Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>::increment(&local_68)
            ;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void handle(const InterfacePortSymbol& symbol) {
        if (!handleDefault(symbol))
            return;
        symbol.getDeclaredRange();

        if (symbol.interfaceDef) {
            usedIfacePorts.emplace(symbol.interfaceDef);

            // If this interface port specifies a modport and that
            // modport has export methods, store it in a list for later
            // processing and checking.
            if (!symbol.modport.empty()) {
                auto [_, modport] = symbol.getConnection();
                if (modport) {
                    for (auto& method : modport->membersOfType<MethodPrototypeSymbol>()) {
                        if (method.flags.has(MethodFlags::ModportExport)) {
                            modportsWithExports.push_back({&symbol, modport});
                            break;
                        }
                    }
                }
            }
        }
    }